

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

bool __thiscall LinearNE<2,_3,_1>::propagate(LinearNE<2,_3,_1> *this)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  Lit *pLVar4;
  IntView<2> *this_00;
  long in_RDI;
  int i_3;
  int i_2;
  Clause *m_r_1;
  int i_1;
  int k;
  int i;
  Clause *m_r;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  BoolView *in_stack_ffffffffffffff60;
  undefined1 uVar5;
  BoolView *in_stack_ffffffffffffff68;
  long v;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff70;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff78;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  Reason local_60;
  Reason local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  Clause *local_38;
  int local_30;
  int local_2c;
  Reason local_28;
  int local_20;
  int local_1c;
  Clause *local_18;
  
  bVar1 = BoolView::isFalse(in_stack_ffffffffffffff60);
  if (bVar1) {
    return true;
  }
  iVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x48));
  if (iVar2 == 0) {
    iVar3 = Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x50));
    if (iVar3 != 0) {
      return true;
    }
    local_18 = (Clause *)0x0;
    if ((so.lazy & 1U) != 0) {
      local_18 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x18); local_1c = local_1c + 1) {
        local_20 = (int)IntView<2>::getValLit
                                  ((IntView<2> *)
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        pLVar4->x = local_20;
      }
    }
    uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
    Reason::Reason(&local_28,local_18);
    bVar1 = BoolView::setVal(in_stack_ffffffffffffff68,(bool)uVar5,(Reason)in_stack_ffffffffffffff70
                            );
    return bVar1;
  }
  bVar1 = BoolView::isTrue(in_stack_ffffffffffffff60);
  if (!bVar1) {
    return true;
  }
  local_2c = 0;
  while (bVar1 = IntView<2>::isFixed((IntView<2> *)0x2692a4), local_30 = local_2c, bVar1) {
    local_2c = local_2c + 1;
  }
  do {
    local_30 = local_30 + 1;
  } while (local_30 < *(int *)(in_RDI + 0x18));
  if (local_2c < *(int *)(in_RDI + 0x14)) {
    Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x50));
    bVar1 = IntView<2>::remValNotR
                      ((IntView<2> *)in_stack_ffffffffffffff60,
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar1) goto LAB_00269374;
  }
  if (local_2c < *(int *)(in_RDI + 0x14)) {
    return true;
  }
  Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x50));
  bVar1 = IntView<3>::remValNotR
                    ((IntView<3> *)in_stack_ffffffffffffff60,
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (!bVar1) {
    return true;
  }
LAB_00269374:
  local_38 = (Clause *)0x0;
  if ((so.lazy & 1U) != 0) {
    local_38 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    for (local_3c = 0; local_44 = local_2c, local_3c < local_2c; local_3c = local_3c + 1) {
      local_40 = (int)IntView<2>::getValLit
                                ((IntView<2> *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      pLVar4->x = local_40;
    }
    while (local_44 = local_44 + 1, local_44 < *(int *)(in_RDI + 0x18)) {
      local_48 = (int)IntView<2>::getValLit
                                ((IntView<2> *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      pLVar4->x = local_48;
    }
    local_4c = (int)BoolView::getValLit((BoolView *)
                                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                ));
    pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    pLVar4->x = local_4c;
  }
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
  if (local_2c < *(int *)(in_RDI + 0x14)) {
    this_00 = (IntView<2> *)(*(long *)(in_RDI + 0x20) + (long)local_2c * 0x10);
    iVar3 = Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x50));
    r._a = -iVar3;
    Reason::Reason(&local_58,local_38);
    bVar1 = IntView<2>::remVal(this_00,(int64_t)in_stack_ffffffffffffff68,(Reason)r,(bool)uVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
  }
  else {
    uVar5 = (undefined1)((ulong)(*(long *)(in_RDI + 0x28) + (long)local_2c * 0x10) >> 0x38);
    iVar3 = Tint64_t::operator_cast_to_long((Tint64_t *)(in_RDI + 0x50));
    v = -iVar3;
    Reason::Reason(&local_60,local_38);
    bVar1 = IntView<3>::remVal((IntView<3> *)in_stack_ffffffffffffff70._pt,v,
                               (Reason)in_stack_ffffffffffffff78,(bool)uVar5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}